

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O0

void __thiscall S2RegionCoverer::Options::set_level_mod(Options *this,int level_mod)

{
  ostream *poVar1;
  int *piVar2;
  int local_5c [2];
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  Options *pOStack_10;
  int level_mod_local;
  Options *this_local;
  
  local_29 = 0;
  local_14 = level_mod;
  pOStack_10 = this;
  if (level_mod < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x51,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (level_mod) >= (1) ");
    S2LogMessageVoidify::operator&(&local_15,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  local_51 = 0;
  if (3 < local_14) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x52,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar1 = S2LogMessage::stream(&local_50);
    poVar1 = std::operator<<(poVar1,"Check failed: (level_mod) <= (3) ");
    S2LogMessageVoidify::operator&(local_3d,poVar1);
  }
  if ((local_51 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  local_5c[1] = 1;
  local_5c[0] = 3;
  piVar2 = std::min<int>(local_5c,&local_14);
  piVar2 = std::max<int>(local_5c + 1,piVar2);
  this->level_mod_ = *piVar2;
  return;
}

Assistant:

void S2RegionCoverer::Options::set_level_mod(int level_mod) {
  S2_DCHECK_GE(level_mod, 1);
  S2_DCHECK_LE(level_mod, 3);
  level_mod_ = max(1, min(3, level_mod));
}